

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O0

int Kit_TruthToGia2(Gia_Man_t *pMan,uint *pTruth0,uint *pTruth1,int nVars,Vec_Int_t *vMemory,
                   Vec_Int_t *vLeaves,int fHash)

{
  int iVar1;
  Vec_Int_t *vMemory_00;
  Kit_Graph_t *local_48;
  Kit_Graph_t *pGraph;
  int iLit;
  Vec_Int_t *vLeaves_local;
  Vec_Int_t *vMemory_local;
  int nVars_local;
  uint *pTruth1_local;
  uint *pTruth0_local;
  Gia_Man_t *pMan_local;
  
  if (vMemory == (Vec_Int_t *)0x0) {
    vMemory_00 = Vec_IntAlloc(0);
    local_48 = Kit_TruthToGraph2(pTruth0,pTruth1,nVars,vMemory_00);
    Vec_IntFree(vMemory_00);
  }
  else {
    local_48 = Kit_TruthToGraph2(pTruth0,pTruth1,nVars,vMemory);
  }
  if (local_48 == (Kit_Graph_t *)0x0) {
    printf("Kit_TruthToGia2(): Converting truth table to AIG has failed for function:\n");
    Kit_DsdPrintFromTruth(pTruth0,nVars);
    printf("\n");
    Kit_DsdPrintFromTruth(pTruth1,nVars);
    printf("\n");
  }
  iVar1 = Kit_GraphToGia(pMan,local_48,vLeaves,fHash);
  Kit_GraphFree(local_48);
  return iVar1;
}

Assistant:

int Kit_TruthToGia2( Gia_Man_t * pMan, unsigned * pTruth0, unsigned * pTruth1, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash )
{
    int iLit;
    Kit_Graph_t * pGraph;
    // transform truth table into the decomposition tree
    if ( vMemory == NULL )
    {
        vMemory = Vec_IntAlloc( 0 );
        pGraph = Kit_TruthToGraph2( pTruth0, pTruth1, nVars, vMemory );
        Vec_IntFree( vMemory );
    }
    else
        pGraph = Kit_TruthToGraph2( pTruth0, pTruth1, nVars, vMemory );
    if ( pGraph == NULL )
    {
        printf( "Kit_TruthToGia2(): Converting truth table to AIG has failed for function:\n" );
        Kit_DsdPrintFromTruth( pTruth0, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( pTruth1, nVars ); printf( "\n" );
    }
    // derive the AIG for the decomposition tree
    iLit = Kit_GraphToGia( pMan, pGraph, vLeaves, fHash );
    Kit_GraphFree( pGraph );
    return iLit;
}